

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O1

void __thiscall CLayerTiles::PrepareForSave(CLayerTiles *this)

{
  char *pcVar1;
  CEditor *pCVar2;
  CEditorImage *pCVar3;
  bool bVar4;
  uint uVar5;
  CLayerTiles *pCVar6;
  CTile *pCVar7;
  ulong uVar8;
  int iVar9;
  uchar uVar10;
  uchar *puVar11;
  byte unaff_BPL;
  char cVar12;
  CLayerTiles *pCVar13;
  ulong uVar14;
  CLayerTiles *pCVar15;
  int iVar16;
  ulong unaff_R14;
  CLayerTiles *unaff_R15;
  
  iVar16 = this->m_Height;
  pCVar6 = (CLayerTiles *)(long)iVar16;
  pCVar13 = this;
  if (0 < (long)pCVar6) {
    uVar5 = this->m_Width;
    puVar11 = &this->m_pTiles->m_Flags;
    pCVar13 = (CLayerTiles *)0x0;
    do {
      if (0 < (int)uVar5) {
        uVar14 = 0;
        do {
          puVar11[uVar14 * 4] = puVar11[uVar14 * 4] & 0xb;
          if (puVar11[uVar14 * 4 + -1] == '\0') {
            puVar11[uVar14 * 4] = '\0';
          }
          uVar14 = uVar14 + 1;
        } while (uVar5 != uVar14);
      }
      pCVar13 = (CLayerTiles *)((long)&(pCVar13->super_CLayer)._vptr_CLayer + 1);
      puVar11 = puVar11 + (ulong)uVar5 * 4;
    } while (pCVar13 != pCVar6);
  }
  iVar9 = this->m_Image;
  if (0 < iVar16 && ((this->m_Color).a == 0xff && (long)iVar9 != -1)) {
    uVar5 = this->m_Width;
    pCVar2 = (this->super_CLayer).m_pEditor;
    pCVar13 = (CLayerTiles *)&this->m_pTiles->m_Flags;
    pCVar15 = (CLayerTiles *)0x0;
    do {
      if (0 < (int)uVar5) {
        pCVar3 = (pCVar2->m_Map).m_lImages.list[iVar9];
        uVar14 = 0;
        do {
          unaff_R14 = (ulong)(byte)(pCVar13->super_CLayer).m_aName[uVar14 * 4 + -0x11];
          unaff_BPL = pCVar3->m_aTileFlags[unaff_R14];
          pcVar1 = (pCVar13->super_CLayer).m_aName + uVar14 * 4 + -0x10;
          *pcVar1 = *pcVar1 | unaff_BPL;
          uVar14 = uVar14 + 1;
        } while (uVar5 != uVar14);
      }
      pCVar15 = (CLayerTiles *)((long)&(pCVar15->super_CLayer)._vptr_CLayer + 1);
      pCVar13 = (CLayerTiles *)((pCVar13->super_CLayer).m_aName + (ulong)uVar5 * 4 + -0x10);
    } while (pCVar15 != pCVar6);
  }
  uVar5 = iVar16 * this->m_Width;
  if ((int)uVar5 < 1) {
    iVar16 = 0;
    pCVar13 = unaff_R15;
  }
  else {
    pCVar7 = this->m_pTiles;
    uVar14 = 0;
    cVar12 = -1;
    iVar16 = 0;
    do {
      if (((cVar12 == -1) || (pCVar7[uVar14].m_Index != (byte)pCVar13)) ||
         (pCVar7[uVar14].m_Flags != unaff_BPL)) {
        unaff_BPL = pCVar7[uVar14].m_Flags;
        unaff_R14 = (ulong)pCVar7[uVar14].m_Reserved;
        iVar16 = iVar16 + 1;
        cVar12 = '\0';
        pCVar13 = (CLayerTiles *)(ulong)pCVar7[uVar14].m_Index;
      }
      else {
        cVar12 = cVar12 + '\x01';
        pCVar13 = (CLayerTiles *)((ulong)pCVar13 & 0xffffffff);
      }
      uVar14 = uVar14 + 1;
    } while (uVar5 != uVar14);
  }
  if (this->m_pSaveTiles != (CTile *)0x0) {
    operator_delete__(this->m_pSaveTiles);
  }
  uVar14 = 0xffffffffffffffff;
  if (-1 < iVar16) {
    uVar14 = (long)iVar16 * 4;
  }
  pCVar7 = (CTile *)operator_new__(uVar14);
  this->m_pSaveTiles = pCVar7;
  this->m_SaveTilesSize = iVar16 << 2;
  uVar5 = this->m_Height * this->m_Width;
  uVar14 = (ulong)uVar5;
  if (-1 < (int)uVar5) {
    uVar10 = 0xff;
    iVar16 = 0;
    uVar8 = 0;
    do {
      if (((uVar10 == 0xff || uVar8 == (uVar14 & 0xffffffff)) ||
          (this->m_pTiles[uVar8].m_Index != (uchar)pCVar13)) ||
         (this->m_pTiles[uVar8].m_Flags != unaff_BPL)) {
        iVar9 = iVar16;
        if (uVar8 != 0) {
          pCVar7 = this->m_pSaveTiles;
          iVar9 = iVar16 + 1;
          pCVar7[iVar16].m_Index = (uchar)pCVar13;
          pCVar7[iVar16].m_Flags = unaff_BPL;
          pCVar7[iVar16].m_Skip = uVar10;
          pCVar7[iVar16].m_Reserved = (uchar)unaff_R14;
        }
        iVar16 = iVar9;
        if (uVar8 != (uint)(this->m_Height * this->m_Width)) {
          pCVar7 = this->m_pTiles;
          pCVar13 = (CLayerTiles *)(ulong)pCVar7[uVar8].m_Index;
          unaff_BPL = pCVar7[uVar8].m_Flags;
          unaff_R14 = (ulong)pCVar7[uVar8].m_Reserved;
          uVar10 = '\0';
        }
      }
      else {
        uVar10 = uVar10 + '\x01';
      }
      uVar14 = (long)this->m_Height * (long)this->m_Width;
      bVar4 = (long)uVar8 < (long)uVar14;
      uVar8 = uVar8 + 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void CLayerTiles::PrepareForSave()
{
	for(int y = 0; y < m_Height; y++)
		for(int x = 0; x < m_Width; x++)
		{
			m_pTiles[y*m_Width+x].m_Flags &= TILEFLAG_VFLIP|TILEFLAG_HFLIP|TILEFLAG_ROTATE;
			if(m_pTiles[y*m_Width+x].m_Index == 0)
				m_pTiles[y*m_Width+x].m_Flags = 0;
		}

	if(m_Image != -1 && m_Color.a == 255)
	{
		for(int y = 0; y < m_Height; y++)
			for(int x = 0; x < m_Width; x++)
				m_pTiles[y*m_Width+x].m_Flags |= m_pEditor->m_Map.m_lImages[m_Image]->m_aTileFlags[m_pTiles[y*m_Width+x].m_Index];
	}

	int NumSaveTiles = 0; // number of unique tiles that we have to save
	CTile Tile; // current tile to be duplicated
	Tile.m_Skip = MAX_SKIP; // tell the code that we can't skip the first tile

	int NumHitMaxSkip = -1;

	for(int i = 0; i < m_Width * m_Height; i++)
	{
		// we can only store MAX_SKIP empty tiles in one tile
		if(Tile.m_Skip == MAX_SKIP)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
			NumHitMaxSkip++;
		}
		// tile is different from last one? - can't skip it
		else if(m_pTiles[i].m_Index != Tile.m_Index || m_pTiles[i].m_Flags != Tile.m_Flags)
		{
			Tile = m_pTiles[i];
			Tile.m_Skip = 0;
			NumSaveTiles++;
		}
		// if the tile is the same as the previous one - no need to
		// save it separately
		else
			Tile.m_Skip++;
	}

	if(m_pSaveTiles)
		delete [] m_pSaveTiles;

	m_pSaveTiles = new CTile[NumSaveTiles];
	m_SaveTilesSize = sizeof(CTile) * NumSaveTiles;

	int NumWrittenSaveTiles = 0;
	Tile.m_Skip = MAX_SKIP;
	for(int i = 0; i < m_Width * m_Height + 1; i++)
	{
		// again, if an tile is the same as the previous one
		// and we have place to store it, skip it!
		// if we are at the end of the layer, write one more tile
		if(i != m_Width * m_Height && Tile.m_Skip != MAX_SKIP && m_pTiles[i].m_Index == Tile.m_Index && m_pTiles[i].m_Flags == Tile.m_Flags)
		{
			Tile.m_Skip++;
		}
		// tile is not skippable
		else
		{
			// if this is not the first tile, we have to save the previous
			// tile beforehand
			if(i != 0)
				m_pSaveTiles[NumWrittenSaveTiles++] = Tile;

			// if this isn't the last tile, store it so we can check how
			// many tiles to skip
			if(i != m_Width * m_Height)
			{
				Tile = m_pTiles[i];
				Tile.m_Skip = 0;
			}
		}
	}
}